

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

bool __thiscall Matrix::bShapeEqual(Matrix *this,Matrix *m)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  int i;
  long lVar4;
  
  iVar3 = this->nMatrixDimension;
  if (iVar3 == m->nMatrixDimension) {
    bVar1 = true;
    for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
      if (this->pSize[lVar4] != m->pSize[lVar4]) {
        poVar2 = std::operator<<((ostream *)&std::cout,"error: size mismatch at dimension ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar4);
        poVar2 = std::operator<<(poVar2," in matrix operation ");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar3 = this->nMatrixDimension;
        bVar1 = false;
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "error: dimensionality mismatch in matrix operation ");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matrix::bShapeEqual( const Matrix &m )
{
	bool ok = true;
	// check shape
	if( nMatrixDimension != m.nMatrixDimension ) {
		cout << "error: dimensionality mismatch in matrix operation " << endl;
		ok = false;
	} else {
		for(int i=0; i<nMatrixDimension; i++)
			if( pSize[i] != m.pSize[i] ) {
				cout << "error: size mismatch at dimension " << i << " in matrix operation " << endl;
				ok = false;
			}
	}
	return ok;
}